

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O2

ref<immutable::rrb_details::internal_node<int,_true>_> *
immutable::rrb_details::new_editable_path<int,true,5>
          (ref<immutable::rrb_details::internal_node<int,_true>_> *to_set,uint32_t empty_height,
          guid_type guid)

{
  internal_node<int,_true> *piVar1;
  internal_node<int,_true> *piVar2;
  int iVar3;
  bool bVar4;
  ref<immutable::rrb_details::internal_node<int,_true>_> empty;
  ref<immutable::rrb_details::internal_node<int,_true>_> new_empty;
  
  if (empty_height != 0) {
    piVar1 = transient_internal_node_create<int,true,5>();
    piVar1->guid = guid;
    piVar1->len = 1;
    LOCK();
    (piVar1->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
    iVar3 = empty_height - 1;
    empty.ptr = piVar1;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      new_empty.ptr = transient_internal_node_create<int,true,5>();
      if (new_empty.ptr != (internal_node<int,_true> *)0x0) {
        LOCK();
        ((new_empty.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
      }
      piVar2 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&new_empty);
      piVar2->len = 1;
      piVar2 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&new_empty);
      piVar2->guid = guid;
      piVar2 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&new_empty);
      ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(piVar2->child,&empty);
      ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(&empty,&new_empty);
      ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&new_empty);
    }
    ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(to_set,&empty);
    to_set = piVar1->child;
    ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&empty);
  }
  return to_set;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>>* new_editable_path(ref<internal_node<T, atomic_ref_counting>>* to_set, uint32_t empty_height, guid_type guid)
      {
      if (0 < empty_height)
        {
        internal_node<T, atomic_ref_counting>* leaf = transient_internal_node_create<T, atomic_ref_counting, N>();
        leaf->guid = guid;
        leaf->len = 1;

        ref<internal_node<T, atomic_ref_counting>> empty = leaf;
        for (uint32_t i = 1; i < empty_height; i++)
          {
          ref<internal_node<T, atomic_ref_counting>> new_empty = transient_internal_node_create<T, atomic_ref_counting, N>();
          new_empty->len = 1;
          new_empty->guid = guid;
          new_empty->child[0] = empty;
          empty = new_empty;
          }
        *to_set = empty;
        return &leaf->child[0];
        }
      else
        {
        return to_set;
        }
      }